

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O0

int mk_vhost_map_handlers(mk_server *server)

{
  mk_plugin *pmVar1;
  mk_list *__mptr_1;
  mk_list *__mptr;
  mk_plugin *p;
  mk_vhost_handler *h_handler;
  mk_vhost *host;
  mk_list *head_handler;
  mk_list *head;
  int n;
  mk_server *server_local;
  
  head._4_4_ = 0;
  for (head_handler = (server->hosts).next; head_handler != &server->hosts;
      head_handler = head_handler->next) {
    for (host = (mk_vhost *)head_handler[-1].next; host != (mk_vhost *)(head_handler + -1);
        host = (mk_vhost *)host->file) {
      pmVar1 = mk_plugin_lookup((char *)host[-1].config,server);
      if (pmVar1 == (mk_plugin *)0x0) {
        mk_print(0x1001,"Plugin \'%s\' was not loaded",host[-1].config);
      }
      else if (pmVar1->hooks == 0x100) {
        host[-1]._head.next = (mk_list *)pmVar1;
        head._4_4_ = head._4_4_ + 1;
      }
      else {
        mk_print(0x1001,"Plugin \'%s\' is not a handler",host[-1].config);
      }
    }
  }
  return head._4_4_;
}

Assistant:

int mk_vhost_map_handlers(struct mk_server *server)
{
    int n = 0;
    struct mk_list *head;
    struct mk_list *head_handler;
    struct mk_vhost *host;
    struct mk_vhost_handler *h_handler;
    struct mk_plugin *p;

    mk_list_foreach(head, &server->hosts) {
        host = mk_list_entry(head, struct mk_vhost, _head);
        mk_list_foreach(head_handler, &host->handlers) {
            h_handler = mk_list_entry(head_handler,
                                      struct mk_vhost_handler, _head);

            /* Lookup plugin by name */
            p = mk_plugin_lookup(h_handler->name, server);
            if (!p) {
                mk_err("Plugin '%s' was not loaded", h_handler->name);
                continue;
            }

            if (p->hooks != MK_PLUGIN_STAGE) {
                mk_err("Plugin '%s' is not a handler", h_handler->name);
                continue;
            }

            h_handler->handler = p;
            n++;
        }
    }

    return n;
}